

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O1

int onig_set_retraction_callout_of_match_param(OnigMatchParam *param,OnigCalloutFunc f)

{
  param->retraction_callout_of_contents = f;
  return 0;
}

Assistant:

extern int
onig_set_retraction_callout_of_match_param(OnigMatchParam* param, OnigCalloutFunc f)
{
#ifdef USE_CALLOUT
  param->retraction_callout_of_contents = f;
  return ONIG_NORMAL;
#else
  return ONIG_NO_SUPPORT_CONFIG;
#endif
}